

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> * __thiscall
rangeless::fn::impl::concat::operator()
          (vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           *__return_storage_ptr__,concat *this,
          vector<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
          *src)

{
  pointer pvVar1;
  vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *v;
  pointer pvVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = (src->
           super__Vector_base<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar2 = (src->
                super__Vector_base<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::allocator<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar2 != pvVar1; pvVar2 = pvVar2 + 1) {
    std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>>,void>
              ((vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
               _M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
                )(pvVar2->
                 super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
                )(pvVar2->
                 super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

Ret operator()(Iterable src) const
        {
            // TODO: return a vector instead? What if cont is a set or a map?

            Ret ret{};
            ret.clear(); // [compilation-error-hint]: Expecting Iterable::value_type to be a container.

            for(auto&& v : src) {
                ret.insert(ret.end(),
                           std::make_move_iterator(v.begin()),
                           std::make_move_iterator(v.end()));
            }

            return ret;
        }